

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

_Bool sysbvm_astNode_isMacroExpression(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  ulong *puVar1;
  ulong uVar2;
  _Bool _Var3;
  byte bVar4;
  uint uVar5;
  
  _Var3 = sysbvm_tuple_isKindOf(context,tuple,(context->roots).astLiteralNodeType);
  if (!_Var3) {
    return false;
  }
  if (((((tuple & 0xf) == 0 && tuple != 0) &&
       (puVar1 = *(ulong **)(tuple + 0x28), ((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0))
      && (uVar2 = *puVar1, (uVar2 & 0xf) == 0 && uVar2 != 0)) &&
     ((*(byte *)(uVar2 + 8) & 0x80) == 0)) {
    uVar2 = *(ulong *)(uVar2 + 0x70);
    if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
      uVar5 = (uint)((long)uVar2 >> 4);
    }
    else {
      uVar5 = (uint)*(undefined8 *)(uVar2 + 0x10);
    }
    if ((uVar5 >> 0xc & 1) != 0) {
      uVar2 = puVar1[5];
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        bVar4 = (byte)((long)uVar2 >> 4);
      }
      else {
        bVar4 = (byte)*(undefined8 *)(uVar2 + 0x10);
      }
      goto LAB_001408da;
    }
  }
  bVar4 = 0;
LAB_001408da:
  return (_Bool)(bVar4 & 1);
}

Assistant:

SYSBVM_API bool sysbvm_astNode_isMacroExpression(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    if(sysbvm_astNode_isLiteralNode(context, tuple))
        return sysbvm_function_isMacro(context, sysbvm_astLiteralNode_getValue(tuple));

    return false;
}